

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void f_Ccall(lua_State *L,void *ud)

{
  StkId pTVar1;
  Table *e;
  GCObject *pGVar2;
  TValue *i_o_1;
  TValue *i_o;
  Closure *cl;
  CCallS *c;
  void *ud_local;
  lua_State *L_local;
  
  e = getcurrenv(L);
  pGVar2 = (GCObject *)luaF_newCclosure(L,0,e);
  (pGVar2->h).node = *ud;
  pTVar1 = L->top;
  (pTVar1->value).gc = pGVar2;
  pTVar1->tt = 6;
  L->top = L->top + 1;
  pTVar1 = L->top;
  pTVar1->value = *(Value *)((long)ud + 8);
  pTVar1->tt = 2;
  L->top = L->top + 1;
  luaD_call(L,L->top + -2,0);
  return;
}

Assistant:

static void f_Ccall (lua_State *L, void *ud) {
  struct CCallS *c = cast(struct CCallS *, ud);
  Closure *cl;
  cl = luaF_newCclosure(L, 0, getcurrenv(L));
  cl->c.f = c->func;
  setclvalue(L, L->top, cl);  /* push function */
  api_incr_top(L);
  setpvalue(L->top, c->ud);  /* push only argument */
  api_incr_top(L);
  luaD_call(L, L->top - 2, 0);
}